

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float * __thiscall ImGuiStorage::GetFloatRef(ImGuiStorage *this,ImGuiID key,float default_val)

{
  ImGuiStoragePair *pIVar1;
  ImGuiID in_ESI;
  ImVector<ImGuiStorage::ImGuiStoragePair> *in_RDI;
  float in_XMM0_Da;
  ImGuiStoragePair *it;
  ImGuiStoragePair *v;
  ImGuiStoragePair *in_stack_ffffffffffffffd8;
  anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 in_stack_ffffffffffffffe0;
  ImGuiStoragePair *local_18;
  
  local_18 = LowerBound(in_RDI,in_ESI);
  v = local_18;
  pIVar1 = ImVector<ImGuiStorage::ImGuiStoragePair>::end(in_RDI);
  if ((v == pIVar1) || (local_18->key != in_ESI)) {
    ImGuiStoragePair::ImGuiStoragePair
              ((ImGuiStoragePair *)&stack0xffffffffffffffd8,in_ESI,in_XMM0_Da);
    local_18 = ImVector<ImGuiStorage::ImGuiStoragePair>::insert
                         ((ImVector<ImGuiStorage::ImGuiStoragePair> *)
                          in_stack_ffffffffffffffe0.val_p,in_stack_ffffffffffffffd8,v);
  }
  return (float *)&local_18->field_1;
}

Assistant:

float* ImGuiStorage::GetFloatRef(ImGuiID key, float default_val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, ImGuiStoragePair(key, default_val));
    return &it->val_f;
}